

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  uint128_wrapper *puVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  int iVar19;
  char cVar20;
  int in_ESI;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  decimal_fp<double> dVar26;
  
  uVar24 = (ulong)x & 0xfffffffffffff;
  if (((ulong)x & 0x7ff0000000000000) == 0) {
    uVar25 = 0xfffffbce;
    if (uVar24 == 0) {
      uVar21 = 0;
      iVar19 = 0;
      goto LAB_0011872f;
    }
LAB_00118300:
    iVar19 = (int)(uVar25 * 0x134413) >> 0x16;
    iVar12 = iVar19 + -2;
    puVar13 = cache_accessor<double>::get_cached_power
                        ((uint128_wrapper *)(ulong)(2U - iVar19),in_ESI);
    bVar14 = (char)((int)((2U - iVar19) * 0x1a934f) >> 0x13) + (char)uVar25;
    uVar23 = uVar24 * 2;
    lVar1 = uVar24 * 2 + 1;
    uVar21 = lVar1 << (bVar14 & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar21;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = extraout_RDX;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar21;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = puVar13;
    uVar17 = SUB168(auVar2 * auVar7,8) +
             (ulong)CARRY8(SUB168(auVar3 * auVar8,8),SUB168(auVar2 * auVar7,0));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar17;
    uVar21 = SUB168(auVar4 * ZEXT816(0x83126e978d4fdf3c),8) >> 9;
    uVar15 = (int)uVar17 + (int)uVar21 * -1000;
    uVar22 = (uint)(extraout_RDX >> (~bVar14 & 0x3f));
    if (uVar15 <= uVar22) {
      if (uVar15 < uVar22) {
        if (((((int)uVar25 < -2) || (uVar15 != 0)) || ((uVar24 & 1) == 0)) ||
           ((9 < (int)uVar25 &&
            ((0x56 < uVar25 ||
             (uVar17 = lVar1 * *(long *)(basic_data<void>::divtest_table_for_pow5_64 +
                                        (long)iVar12 * 0x10),
             *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + (long)iVar12 * 0x10 + 8) <=
             uVar17 && uVar17 - *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 +
                                          (long)iVar12 * 0x10 + 8) != 0)))))) {
LAB_0011865b:
          iVar19 = iVar19 + 1;
          uVar24 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar15 = (uint)uVar24;
          uVar25 = 0x10;
          if (uVar15 < 0x10) {
            uVar25 = uVar15;
          }
          if (uVar24 < 8) {
            if (uVar24 == 0) goto LAB_00118704;
          }
          else if (uVar21 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
            uVar22 = (uint)(uVar21 * -0x3898f8b4dd16f1df >> 8);
            uVar11 = 8;
            if (uVar15 != 8) {
              uVar15 = 9;
              if (9 < uVar25) {
                uVar15 = uVar25;
              }
              uVar25 = 8;
              do {
                uVar18 = uVar22 * -0x33333333;
                uVar11 = uVar25;
                if (0x33333333 < uVar18) break;
                uVar25 = uVar25 + 1;
                uVar22 = uVar18;
                uVar11 = uVar15;
              } while (uVar15 != uVar25);
            }
            goto LAB_001186c9;
          }
          uVar24 = uVar21 / 100000000;
          iVar12 = (int)uVar21 + (int)uVar24 * -100000000;
          uVar25 = iVar12 * -0x33333333;
          if (0x33333333 < uVar25) goto LAB_00118704;
          if ((uVar15 == 1) || (uVar22 = iVar12 * -0x3d70a3d7, 0x33333333 < uVar22)) {
LAB_00118725:
            uVar21 = uVar24 * 10000000 + (ulong)(uVar25 >> 1);
            uVar11 = 1;
          }
          else if ((uVar15 == 2) || (uVar25 = iVar12 * 0x26e978d5, 0x33333333 < uVar25)) {
LAB_001187c5:
            uVar21 = uVar24 * 1000000 + (ulong)(uVar22 >> 2);
            uVar11 = 2;
          }
          else if ((uVar15 == 3) || (uVar22 = iVar12 * 0x3afb7e91, 0x33333333 < uVar22)) {
LAB_00118812:
            uVar21 = uVar24 * 100000 + (ulong)(uVar25 >> 3);
            uVar11 = 3;
          }
          else if ((uVar15 == 4) || (uVar25 = iVar12 * 0xbcbe61d, 0x33333333 < uVar25)) {
LAB_00118861:
            uVar21 = uVar24 * 10000 + (ulong)(uVar22 >> 4);
            uVar11 = 4;
          }
          else if ((uVar15 == 5) || (uVar22 = iVar12 * 0x68c26139, 0x33333333 < uVar22)) {
LAB_001188ae:
            uVar21 = uVar24 * 1000 + (ulong)(uVar25 >> 5);
            uVar11 = 5;
          }
          else {
            if ((uVar15 == 6) || (uVar25 = iVar12 * -0x5172b95b, 0x33333333 < uVar25))
            goto LAB_001188f1;
LAB_00118910:
            uVar21 = (ulong)(uVar25 >> 7) + uVar24 * 10;
            uVar11 = 7;
          }
          goto LAB_0011872d;
        }
        uVar21 = uVar21 - 1;
        uVar15 = 1000;
      }
      else {
        uVar17 = uVar23 - 1;
        if ((((-3 < (int)uVar25) && ((uVar24 & 1) == 0)) &&
            (((int)uVar25 < 10 ||
             ((uVar25 < 0x57 &&
              (*(long *)(basic_data<void>::divtest_table_for_pow5_64 + (long)iVar12 * 0x10) * uVar17
               < *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + (long)iVar12 * 0x10 + 8)
               || *(long *)(basic_data<void>::divtest_table_for_pow5_64 + (long)iVar12 * 0x10) *
                  uVar17 - *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 +
                                     (long)iVar12 * 0x10 + 8) == 0)))))) ||
           (auVar5._8_8_ = 0, auVar5._0_8_ = puVar13, auVar9._8_8_ = 0, auVar9._0_8_ = uVar17,
           (SUB168(auVar5 * auVar9,8) + extraout_RDX * uVar17 >>
            ((ulong)(byte)(0x40 - bVar14) & 0x3f) & 1) != 0)) goto LAB_0011865b;
      }
    }
    iVar16 = uVar15 - (uVar22 >> 1);
    uVar15 = iVar16 + 0x32;
    if ((uVar15 & 3) == 0) {
      uVar15 = (uVar15 >> 2) * 0xa429;
      uVar21 = uVar21 * 10 + (ulong)(uVar15 >> 0x14);
      if ((uVar15 & 0xff) < 0xb) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = puVar13;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar23;
        if (((SUB168(auVar6 * auVar10,8) + extraout_RDX * uVar23 >>
              ((ulong)(byte)(0x40 - bVar14) & 0x3f) & 1) != 0) == (bool)((byte)iVar16 & 1)) {
          if ((int)uVar25 < 0x57) {
            if ((int)uVar25 < 10) {
              if ((int)uVar25 < -4) {
                lVar1 = 0;
                if (uVar24 != 0) {
                  for (; (uVar23 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
                  }
                }
                if ((int)lVar1 <= (int)(iVar12 - uVar25)) goto LAB_0011872f;
              }
            }
            else if (*(ulong *)(basic_data<void>::divtest_table_for_pow5_64 +
                               (long)iVar12 * 0x10 + 8) <=
                     uVar23 * *(long *)(basic_data<void>::divtest_table_for_pow5_64 +
                                       (long)iVar12 * 0x10) &&
                     uVar23 * *(long *)(basic_data<void>::divtest_table_for_pow5_64 +
                                       (long)iVar12 * 0x10) -
                     *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 +
                               (long)iVar12 * 0x10 + 8) != 0) goto LAB_0011872f;
            uVar21 = uVar21 & 0xfffffffffffffffe;
          }
        }
        else {
          uVar21 = uVar21 - 1;
        }
      }
    }
    else {
      uVar21 = uVar21 * 10 + (ulong)(uVar15 * 0xa3d8 >> 0x16);
    }
  }
  else {
    uVar25 = (uint)(((ulong)x & 0x7ff0000000000000) >> 0x34) - 0x433;
    if (uVar24 != 0) {
      uVar24 = uVar24 + 0x10000000000000;
      goto LAB_00118300;
    }
    iVar19 = (int)(uVar25 * 0x134413 + -0x7feff) >> 0x16;
    cVar20 = (char)(iVar19 * -0x1a934f >> 0x13) + (char)uVar25;
    cache_accessor<double>::get_cached_power((uint128_wrapper *)(ulong)(uint)-iVar19,in_ESI);
    bVar14 = 0xb - cVar20;
    uVar24 = (extraout_RDX_00 >> 0x35) + extraout_RDX_00 >> (bVar14 & 0x3f);
    uVar23 = (ulong)((uVar25 & 0xfffffffe) != 2) +
             (extraout_RDX_00 - (extraout_RDX_00 >> 0x36) >> (bVar14 & 0x3f));
    uVar21 = uVar24 / 10;
    if (uVar21 * 10 < uVar23) {
      uVar21 = (extraout_RDX_00 >> (10U - cVar20 & 0x3f)) + 1 >> 1;
      if (uVar25 == 0xffffffb3) {
        uVar21 = uVar21 & 0xfffffffffffffffe;
      }
      else {
        uVar21 = uVar21 + (uVar21 < uVar23);
      }
      goto LAB_0011872f;
    }
    iVar19 = iVar19 + 1;
    uVar23 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
      }
    }
    uVar15 = (uint)uVar23;
    uVar25 = 0x10;
    if (uVar15 < 0x10) {
      uVar25 = uVar15;
    }
    if (uVar23 < 8) {
      if (uVar23 != 0) goto LAB_001185d9;
LAB_00118704:
      uVar11 = 0;
    }
    else if (uVar21 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
      uVar22 = (uint)(uVar21 * -0x3898f8b4dd16f1df >> 8);
      uVar11 = 8;
      if (uVar15 != 8) {
        uVar15 = 9;
        if (9 < uVar25) {
          uVar15 = uVar25;
        }
        uVar25 = 8;
        do {
          uVar18 = uVar22 * -0x33333333;
          uVar11 = uVar25;
          if (0x33333333 < uVar18) break;
          uVar25 = uVar25 + 1;
          uVar22 = uVar18;
          uVar11 = uVar15;
        } while (uVar15 != uVar25);
      }
LAB_001186c9:
      uVar21 = (ulong)(uVar22 >> ((char)uVar11 - 8U & 0x1f));
    }
    else {
LAB_001185d9:
      uVar24 = uVar24 / 1000000000;
      iVar12 = (int)uVar24 * -100000000 + (int)uVar21;
      uVar25 = iVar12 * -0x33333333;
      if (0x33333333 < uVar25) goto LAB_00118704;
      if ((uVar15 == 1) || (uVar22 = iVar12 * -0x3d70a3d7, 0x33333333 < uVar22)) {
        uVar24 = uVar24 & 0xffffffff;
        goto LAB_00118725;
      }
      if ((uVar15 == 2) || (uVar25 = iVar12 * 0x26e978d5, 0x33333333 < uVar25)) {
        uVar24 = uVar24 & 0xffffffff;
        goto LAB_001187c5;
      }
      if ((uVar15 == 3) || (uVar22 = iVar12 * 0x3afb7e91, 0x33333333 < uVar22)) {
        uVar24 = uVar24 & 0xffffffff;
        goto LAB_00118812;
      }
      if ((uVar15 == 4) || (uVar25 = iVar12 * 0xbcbe61d, 0x33333333 < uVar25)) {
        uVar24 = uVar24 & 0xffffffff;
        goto LAB_00118861;
      }
      if ((uVar15 == 5) || (uVar22 = iVar12 * 0x68c26139, 0x33333333 < uVar22)) {
        uVar24 = uVar24 & 0xffffffff;
        goto LAB_001188ae;
      }
      if ((uVar15 != 6) && (uVar25 = iVar12 * -0x5172b95b, uVar25 < 0x33333334)) {
        uVar24 = uVar24 & 0xffffffff;
        goto LAB_00118910;
      }
      uVar24 = uVar24 & 0xffffffff;
LAB_001188f1:
      uVar21 = uVar24 * 100 + (ulong)(uVar22 >> 6);
      uVar11 = 6;
    }
LAB_0011872d:
    iVar19 = iVar19 + uVar11;
  }
LAB_0011872f:
  dVar26.exponent = iVar19;
  dVar26.significand = uVar21;
  dVar26._12_4_ = 0;
  return dVar26;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}